

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O0

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>
::set_options(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>
              *this,unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> *str)

{
  pointer pSVar1;
  long local_38;
  Options *options;
  unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> *str_local;
  ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>
  *this_local;
  
  pSVar1 = std::unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_>::get(str);
  if (pSVar1 == (pointer)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(pSVar1,&Reflection::Struct::typeinfo,&Oric::Machine::Options::typeinfo
                              ,0);
  }
  MachineTypes::ScanProducer::set_video_signal_configurable
            (&this->super_ScanProducer,*(Display *)(local_38 + 8));
  set_use_fast_tape_hack(this,(bool)(*(byte *)(local_38 + 0xc) & 1));
  return;
}

Assistant:

void set_options(const std::unique_ptr<Reflection::Struct> &str) final {
			const auto options = dynamic_cast<Options *>(str.get());
			set_video_signal_configurable(options->output);
			set_use_fast_tape_hack(options->quickload);
		}